

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int QMetaTypeIdQObject<QFlags<QMainWindow::DockOption>,_16>::qt_metatype_id(void)

{
  char *__s;
  QByteArray *this;
  size_t sVar1;
  QByteArray *this_00;
  long in_FS_OFFSET;
  int newId;
  char *cName;
  char *eName;
  int id;
  QByteArray typeName;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_2c;
  undefined1 *asize;
  QFlagsStorage<QMainWindow::DockOption> local_10;
  QFlagsStorage<QMainWindow::DockOption> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x5ee022);
  if (local_2c == 0) {
    memset(&local_c,0,4);
    QFlags<QMainWindow::DockOption>::QFlags((QFlags<QMainWindow::DockOption> *)0x5ee055);
    __s = ::qt_getEnumName((DockOptions)local_c.i);
    memset(&local_10,0,4);
    QFlags<QMainWindow::DockOption>::QFlags((QFlags<QMainWindow::DockOption> *)0x5ee07e);
    ::qt_getEnumMetaObject((DockOptions)local_10.i);
    this = (QByteArray *)QMetaObject::className();
    asize = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x5ee0c2);
    sVar1 = strlen((char *)this);
    this_00 = (QByteArray *)(sVar1 + 2);
    strlen(__s);
    QByteArray::reserve(this,(qsizetype)asize);
    QByteArray::append(this_00,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                      );
    QByteArray::append(this_00,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                      );
    QByteArray::append(this_00,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                      );
    local_2c = qRegisterNormalizedMetaType<QFlags<QMainWindow::DockOption>>((QByteArray *)0x5ee126);
    QBasicAtomicInteger<int>::storeRelease
              ((QBasicAtomicInteger<int> *)this_00,in_stack_ffffffffffffffac);
    QByteArray::~QByteArray((QByteArray *)0x5ee14c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *eName = qt_getEnumName(T());
        const char *cName = qt_getEnumMetaObject(T())->className();
        QByteArray typeName;
        typeName.reserve(strlen(cName) + 2 + strlen(eName));
        typeName.append(cName).append("::").append(eName);
        const int newId = qRegisterNormalizedMetaType<T>(typeName);
        metatype_id.storeRelease(newId);
        return newId;
    }